

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromCpuInfoFile
          (string *__return_storage_ptr__,SystemInformationImplementation *this,string *buffer,
          char *word,size_t init)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  string local_50;
  
  strlen(word);
  sVar5 = std::__cxx11::string::find((char *)buffer,(ulong)word,init);
  if (sVar5 != 0xffffffffffffffff) {
    this->CurrentPositionInFile = sVar5;
    uVar6 = std::__cxx11::string::find((char)buffer,0x3a);
    sVar5 = std::__cxx11::string::find((char)buffer,10);
    if (sVar5 != 0xffffffffffffffff && uVar6 != 0xffffffffffffffff) {
      sVar2 = this->CurrentPositionInFile;
      sVar7 = strlen(word);
      uVar8 = sVar7 + sVar2;
      if (uVar8 < uVar6) {
        pcVar3 = (buffer->_M_dataplus)._M_p;
        do {
          if ((pcVar3[uVar8] != '\t') && (pcVar3[uVar8] != ' ')) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar3,pcVar3 + buffer->_M_string_length);
            ExtractValueFromCpuInfoFile(__return_storage_ptr__,this,&local_50,word,sVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar6);
      }
      std::__cxx11::string::erase((ulong)buffer,0);
      std::__cxx11::string::resize((ulong)buffer,((char)sVar5 - (char)uVar6) + -2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (buffer->_M_dataplus)._M_p;
      paVar1 = &buffer->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar1) {
        uVar4 = *(undefined8 *)((long)&buffer->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = buffer->_M_string_length;
      (buffer->_M_dataplus)._M_p = (pointer)paVar1;
      buffer->_M_string_length = 0;
      (buffer->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  }
  this->CurrentPositionInFile = 0xffffffffffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromCpuInfoFile(
  std::string buffer, const char* word, size_t init)
{
  size_t pos = buffer.find(word, init);
  if (pos != std::string::npos) {
    this->CurrentPositionInFile = pos;
    pos = buffer.find(':', pos);
    size_t pos2 = buffer.find('\n', pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      // It may happen that the beginning matches, but this is still not the
      // requested key.
      // An example is looking for "cpu" when "cpu family" comes first. So we
      // check that
      // we have only spaces from here to pos, otherwise we search again.
      for (size_t i = this->CurrentPositionInFile + strlen(word); i < pos;
           ++i) {
        if (buffer[i] != ' ' && buffer[i] != '\t') {
          return this->ExtractValueFromCpuInfoFile(buffer, word, pos2);
        }
      }
      buffer.erase(0, pos + 2);
      buffer.resize(pos2 - pos - 2);
      return buffer;
    }
  }
  this->CurrentPositionInFile = std::string::npos;
  return "";
}